

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastBS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ParseContext *pPVar1;
  MessageLite *pMVar2;
  uint64_t uVar3;
  TcParseTableBase *this;
  uchar uVar4;
  byte bVar5;
  bool bVar6;
  uint16_t uVar7;
  unsigned_short uVar8;
  uint uVar9;
  char *pcVar10;
  uint *puVar11;
  ulong uVar12;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_188;
  Arena *local_180;
  Arena *arena;
  ArenaStringPtr *field;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_168;
  uchar saved_tag;
  uint64_t local_160;
  TcParseTableBase *local_158;
  ParseContext *local_150;
  char *local_148;
  MessageLite *local_140;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_138;
  TcFieldData local_130;
  TcFieldData local_128;
  undefined1 local_119;
  ulong uStack_118;
  bool always_return;
  TcParseTableBase *local_110;
  ParseContext *local_108;
  char *local_100;
  MessageLite *local_f8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_f0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_e8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_e0;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  
  local_160 = hasbits;
  local_158 = table;
  local_150 = ctx;
  local_148 = ptr;
  local_140 = msg;
  local_138 = data.field_0;
  uVar4 = TcFieldData::coded_tag<unsigned_char>((TcFieldData *)&local_138);
  pMVar2 = local_140;
  pcVar10 = local_148;
  pPVar1 = local_150;
  if (uVar4 != '\0') {
    TcFieldData::TcFieldData((TcFieldData *)&stack0xfffffffffffffe98);
    pcVar10 = MiniParse(pMVar2,pcVar10,pPVar1,(TcFieldData)aStack_168,local_158,local_160);
    return pcVar10;
  }
  field._7_1_ = UnalignedLoad<unsigned_char>(local_148);
  local_148 = local_148 + 1;
  bVar5 = TcFieldData::hasbit_idx((TcFieldData *)&local_138);
  pMVar2 = local_140;
  local_160 = 1L << (bVar5 & 0x3f) | local_160;
  uVar7 = TcFieldData::offset((TcFieldData *)&local_138);
  arena = (Arena *)RefAt<google::protobuf::internal::ArenaStringPtr>(pMVar2,(ulong)uVar7);
  local_180 = MessageLite::GetArena(local_140);
  pMVar2 = local_140;
  pcVar10 = local_148;
  pPVar1 = local_150;
  if (local_180 == (Arena *)0x0) {
    bVar5 = TcFieldData::aux_idx((TcFieldData *)&local_138);
    local_148 = anon_unknown_104::ReadStringNoArena
                          (pMVar2,pcVar10,pPVar1,(uint)bVar5,local_158,(ArenaStringPtr *)arena);
  }
  else {
    TcFieldData::aux_idx((TcFieldData *)&local_138);
    local_148 = EpsCopyInputStream::ReadArenaString
                          (&pPVar1->super_EpsCopyInputStream,pcVar10,(ArenaStringPtr *)arena,
                           local_180);
  }
  pMVar2 = local_140;
  pcVar10 = local_148;
  pPVar1 = local_150;
  if (local_148 == (char *)0x0) {
    anon_unknown_104::EnsureArenaStringIsNotDefault(local_140,(ArenaStringPtr *)arena);
    pMVar2 = local_140;
    pcVar10 = local_148;
    pPVar1 = local_150;
    TcFieldData::TcFieldData((TcFieldData *)&local_188);
    pcVar10 = Error(pMVar2,pcVar10,pPVar1,(TcFieldData)local_188,local_158,local_160);
    return pcVar10;
  }
  TcFieldData::TcFieldData(&data_local);
  local_f0 = data_local.field_0;
  local_f8 = pMVar2;
  local_100 = pcVar10;
  local_108 = pPVar1;
  local_110 = local_158;
  uStack_118 = local_160;
  local_119 = 0;
  bVar6 = EpsCopyInputStream::DataAvailable(&pPVar1->super_EpsCopyInputStream,pcVar10);
  pMVar2 = local_f8;
  pcVar10 = local_100;
  pPVar1 = local_108;
  if (!bVar6) {
    TcFieldData::TcFieldData(&local_128);
    if (local_110->has_bits_offset != 0) {
      uVar9 = (uint)uStack_118;
      puVar11 = RefAt<unsigned_int>(pMVar2,(ulong)(uint)local_110->has_bits_offset);
      *puVar11 = uVar9 | *puVar11;
    }
    return pcVar10;
  }
  TcFieldData::TcFieldData(&local_130);
  this = local_110;
  uVar3 = uStack_118;
  uVar8 = UnalignedLoad<unsigned_short>(pcVar10);
  uVar12 = (ulong)(int)((uint)uVar8 & (uint)this->fast_idx_mask);
  if ((uVar12 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  data_1.field_0 =
       (anon_union_8_1_898a9ca8_for_TcFieldData_0)TcParseTableBase::fast_entry(this,uVar12 >> 3);
  local_e0.data =
       ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
       (ulong)uVar8;
  UNRECOVERED_JUMPTABLE = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0)
  ;
  local_e8.data = local_e0.data;
  pcVar10 = (*UNRECOVERED_JUMPTABLE)(pMVar2,pcVar10,pPVar1,(TcFieldData)local_e0,this,uVar3);
  return pcVar10;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastBS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularString<uint8_t, ArenaStringPtr, kNoUtf8>(
      PROTOBUF_TC_PARAM_PASS);
}